

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageCompareCosDistance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *y,longdouble r2)

{
  longdouble *in_RCX;
  longdouble in_ST0;
  longdouble lVar1;
  uint local_9c;
  longdouble error;
  longdouble diff;
  longdouble cos_r_error;
  longdouble cos_r;
  longdouble cos_xy;
  longdouble cos_xy_error;
  longdouble T_ERR;
  longdouble r2_local;
  Vector3<long_double> *y_local;
  Vector3<long_double> *x_local;
  
  stack0xffffffffffffffd8 = r2;
  register0x00001100 = (longdouble)5.421011e-20;
  unique0x10000037 = y;
  y_local = x;
  GetCosDistance((longdouble *)x,y,(Vector3_ld *)((long)&cos_xy + 8),in_RCX);
  lVar1 = (longdouble)1 + (longdouble)-0.5 * stack0xffffffffffffffd8;
  in_ST0 = in_ST0 - lVar1;
  register0x00001110 = (longdouble)1.0842022e-19 * lVar1 + stack0xffffffffffffffb8;
  if (in_ST0 <= register0x00001110) {
    local_9c = (uint)(in_ST0 < -register0x00001110);
  }
  else {
    local_9c = 0xffffffff;
  }
  return local_9c;
}

Assistant:

int TriageCompareCosDistance(const Vector3<T>& x, const Vector3<T>& y, T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();
  T cos_xy_error;
  T cos_xy = GetCosDistance(x, y, &cos_xy_error);
  T cos_r = 1 - 0.5 * r2;
  T cos_r_error = 2 * T_ERR * cos_r;
  T diff = cos_xy - cos_r;
  T error = cos_xy_error + cos_r_error;
  return (diff > error) ? -1 : (diff < -error) ? 1 : 0;
}